

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.h
# Opt level: O2

void __thiscall FDMDModel::FDMDModel(FDMDModel *this)

{
  int i;
  long lVar1;
  
  (this->super_FModel).mFileName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FModel).mVBuf = (FModelVertexBuffer *)0x0;
  (this->super_FModel)._vptr_FModel = (_func_int **)&PTR__FMD2Model_007c5870;
  this->mLumpNum = -1;
  this->skins = (FTextureID *)0x0;
  this->frames = (ModelFrame *)0x0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->lods[lVar1].triangles = (FTriangle *)0x0;
  }
  (this->info).numLODs = 0;
  this->texCoords = (FTexCoord *)0x0;
  this->framevtx = (ModelFrameVertexData *)0x0;
  return;
}

Assistant:

FString () : Chars(&NullString.Nothing[0]) { NullString.RefCount++; }